

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

RTQuaternion * __thiscall RTQuaternion::operator*=(RTQuaternion *this,RTQuaternion *qb)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  RTQuaternion *pRVar5;
  RTQuaternion qa;
  RTQuaternion local_28;
  
  RTQuaternion(&local_28);
  pRVar5 = &local_28;
  if (&local_28 != this) {
    pRVar5 = this;
  }
  fVar1 = pRVar5->m_data[0];
  fVar2 = this->m_data[1];
  fVar3 = this->m_data[2];
  fVar4 = this->m_data[3];
  this->m_data[0] =
       ((qb->m_data[0] * fVar1 - qb->m_data[1] * fVar2) - qb->m_data[2] * fVar3) -
       qb->m_data[3] * fVar4;
  this->m_data[1] =
       (qb->m_data[3] * fVar3 + qb->m_data[1] * fVar1 + qb->m_data[0] * fVar2) -
       qb->m_data[2] * fVar4;
  this->m_data[2] =
       qb->m_data[1] * fVar4 +
       qb->m_data[0] * fVar3 + (qb->m_data[2] * fVar1 - qb->m_data[3] * fVar2);
  this->m_data[3] =
       fVar4 * qb->m_data[0] +
       ((fVar1 * qb->m_data[3] + fVar2 * qb->m_data[2]) - fVar3 * qb->m_data[1]);
  return this;
}

Assistant:

RTQuaternion& RTQuaternion::operator *=(const RTQuaternion& qb)
{
    RTQuaternion qa;

    qa = *this;

    m_data[0] = qa.scalar() * qb.scalar() - qa.x() * qb.x() - qa.y() * qb.y() - qa.z() * qb.z();
    m_data[1] = qa.scalar() * qb.x() + qa.x() * qb.scalar() + qa.y() * qb.z() - qa.z() * qb.y();
    m_data[2] = qa.scalar() * qb.y() - qa.x() * qb.z() + qa.y() * qb.scalar() + qa.z() * qb.x();
    m_data[3] = qa.scalar() * qb.z() + qa.x() * qb.y() - qa.y() * qb.x() + qa.z() * qb.scalar();

    return *this;
}